

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseProtoFields
          (Parser *this,StructDef *struct_def,bool isextend,bool inside_oneof)

{
  int t;
  StructDef *pSVar1;
  undefined8 uVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  Definition *pDVar6;
  BaseType BVar7;
  BaseType BVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  Value *this_00;
  char *pcVar12;
  char *pcVar13;
  reference ppFVar14;
  EnumVal *pEVar15;
  undefined7 in_register_00000011;
  int t_00;
  byte in_R8B;
  EnumVal *ev;
  EnumValBuilder evb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  Value *local_420;
  Type *oneof_type;
  FieldDef *oneof_field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_408;
  iterator field_it;
  undefined1 local_3f8 [8];
  StructDef oneof_struct;
  string local_2a8 [32];
  char *local_288;
  char *numeric;
  undefined1 local_278 [8];
  string val_1;
  undefined1 local_250 [8];
  string key;
  string local_228;
  Value *local_208;
  Value *val;
  FieldDef *local_1f8;
  FieldDef *field;
  string local_1e8 [8];
  string proto_field_id;
  undefined1 local_1c0 [8];
  string name;
  FieldDef *local_198;
  StructDef *local_190;
  StructDef *local_188;
  uint16_t local_180;
  byte local_171;
  string local_170;
  undefined1 local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_2;
  undefined8 local_128;
  StructDef *local_120;
  uint16_t local_118;
  string local_108;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  undefined1 local_c0 [8];
  Type type;
  EnumDef *oneof_union;
  StructDef *anonymous_struct;
  undefined1 local_88 [5];
  bool oneof;
  bool repeated;
  bool required;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_comment;
  string local_68 [4];
  voffset_t id;
  undefined1 local_47;
  unsigned_short local_46;
  ushort local_44;
  byte local_42;
  byte local_41;
  byte local_40;
  bool done;
  voffset_t attribute;
  voffset_t from;
  bool range;
  byte local_39;
  uint local_38;
  byte local_23;
  byte local_22;
  byte local_21;
  bool inside_oneof_local;
  string *psStack_20;
  bool isextend_local;
  StructDef *struct_def_local;
  Parser *this_local;
  CheckedError *ce;
  
  psStack_20 = (string *)CONCAT71(in_register_00000011,isextend);
  local_22 = in_R8B & 1;
  local_23 = 0;
  t_00 = (int)struct_def;
  local_21 = inside_oneof;
  struct_def_local = struct_def;
  this_local = this;
  Expect(this,t_00);
  bVar9 = CheckedError::Check((CheckedError *)this);
  if (bVar9) {
    local_23 = 1;
  }
  local_38 = (uint)bVar9;
  if ((local_23 & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  while (local_38 == 0) {
    while( true ) {
      if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x7d) {
        Next(this);
        bVar9 = CheckedError::Check((CheckedError *)this);
        local_38 = (uint)bVar9;
        if (!bVar9) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (local_38 == 0) {
          anon_unknown_0::NoError();
        }
        goto LAB_0012e2e9;
      }
      bVar9 = IsIdent((Parser *)struct_def,"message");
      if (((bVar9) || (bVar9 = IsIdent((Parser *)struct_def,"extend"), bVar9)) ||
         (bVar9 = IsIdent((Parser *)struct_def,"enum"), bVar9)) break;
      bVar9 = IsIdent((Parser *)struct_def,"extensions");
      if (bVar9) {
        range = false;
        Next(this);
        bVar9 = CheckedError::Check((CheckedError *)this);
        if (bVar9) {
          range = true;
        }
        local_38 = (uint)bVar9;
        if ((range & 1U) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (local_38 != 0) goto LAB_0012e2e9;
        from._1_1_ = 0;
        Expect(this,t_00);
        bVar9 = CheckedError::Check((CheckedError *)this);
        if (bVar9) {
          from._1_1_ = 1;
        }
        local_38 = (uint)bVar9;
        if ((from._1_1_ & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (local_38 != 0) goto LAB_0012e2e9;
        bVar9 = Is((Parser *)struct_def,0x104);
        if (bVar9) {
          from._0_1_ = 0;
          Next(this);
          bVar9 = CheckedError::Check((CheckedError *)this);
          if (bVar9) {
            from._0_1_ = 1;
          }
          local_38 = (uint)bVar9;
          if (((byte)from & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (local_38 != 0) goto LAB_0012e2e9;
          attribute._1_1_ = 0;
          Next(this);
          bVar9 = CheckedError::Check((CheckedError *)this);
          if (bVar9) {
            attribute._1_1_ = 1;
          }
          local_38 = (uint)bVar9;
          if ((attribute._1_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (local_38 != 0) goto LAB_0012e2e9;
        }
        attribute._0_1_ = 0;
        Expect(this,t_00);
        bVar9 = CheckedError::Check((CheckedError *)this);
        if (bVar9) {
          attribute._0_1_ = 1;
        }
        local_38 = (uint)bVar9;
        if (((byte)attribute & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      }
      else {
        bVar9 = IsIdent((Parser *)struct_def,"option");
        if (bVar9) {
          done = false;
          ParseProtoOption(this);
          bVar9 = CheckedError::Check((CheckedError *)this);
          if (bVar9) {
            done = true;
          }
          local_38 = (uint)bVar9;
          if ((done & 1U) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (local_38 != 0) goto LAB_0012e2e9;
          local_40 = 0;
          Expect(this,t_00);
          bVar9 = CheckedError::Check((CheckedError *)this);
          if (bVar9) {
            local_40 = 1;
          }
          local_38 = (uint)bVar9;
          if ((local_40 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
        }
        else {
          bVar9 = IsIdent((Parser *)struct_def,"reserved");
          if (bVar9) {
            local_41 = 0;
            Next(this);
            bVar9 = CheckedError::Check((CheckedError *)this);
            if (bVar9) {
              local_41 = 1;
            }
            local_38 = (uint)bVar9;
            if ((local_41 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_38 != 0) goto LAB_0012e2e9;
            local_42 = 0;
            local_44 = 0;
            while (bVar9 = Is((Parser *)struct_def,0x3b), ((bVar9 ^ 0xffU) & 1) != 0) {
              if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x102) {
                local_46 = 0;
                pcVar12 = (char *)std::__cxx11::string::c_str();
                local_47 = StringToNumber<unsigned_short>(pcVar12,&local_46);
                if (!(bool)local_47) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_68,"Protobuf has non positive number in reserved ids",
                             (allocator<char> *)
                             ((long)&field_comment.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  Error(this,(string *)struct_def);
                  std::__cxx11::string::~string(local_68);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&field_comment.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  goto LAB_0012e2e9;
                }
                uVar3 = local_44;
                if ((local_42 & 1) == 0) {
                  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             &psStack_20[9].field_2,&local_46);
                }
                else {
                  while (field_comment.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = uVar3 + 1,
                        field_comment.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ <= local_46) {
                    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                               &psStack_20[9].field_2,
                               (value_type_conflict2 *)
                               ((long)&field_comment.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                    uVar3 = field_comment.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_;
                  }
                  local_42 = 0;
                }
                local_44 = local_46;
              }
              bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&(struct_def->super_Definition).file._M_string_length,"to")
              ;
              if (bVar9) {
                local_42 = 1;
              }
              field_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
              Next(this);
              bVar9 = CheckedError::Check((CheckedError *)this);
              if (bVar9) {
                field_comment.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
              }
              local_38 = (uint)bVar9;
              if ((field_comment.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (local_38 != 0) goto LAB_0012e2e9;
            }
            field_comment.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
            Next(this);
            bVar9 = CheckedError::Check((CheckedError *)this);
            if (bVar9) {
              field_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
            }
            local_38 = (uint)bVar9;
            if ((field_comment.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
          }
          else {
            bVar9 = IsIdent((Parser *)struct_def,"map");
            if (bVar9) {
              field_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
              ParseProtoMapField(this,struct_def);
              bVar9 = CheckedError::Check((CheckedError *)this);
              if (bVar9) {
                field_comment.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
              }
              local_38 = (uint)bVar9;
              if ((field_comment.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ & 1) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&(struct_def->super_Definition).doc_comment.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              bVar4 = false;
              bVar9 = false;
              bVar5 = false;
              if ((local_22 & 1) == 0) {
                bVar10 = IsIdent((Parser *)struct_def,"optional");
                if (bVar10) {
                  Next(this);
                  bVar10 = CheckedError::Check((CheckedError *)this);
                  local_38 = (uint)bVar10;
                  if (!bVar10) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                }
                else {
                  bVar10 = IsIdent((Parser *)struct_def,"required");
                  if (bVar10) {
                    bVar4 = true;
                    Next(this);
                    bVar10 = CheckedError::Check((CheckedError *)this);
                    local_38 = (uint)bVar10;
                    if (!bVar10) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                  }
                  else {
                    bVar10 = IsIdent((Parser *)struct_def,"repeated");
                    if (bVar10) {
                      bVar9 = true;
                      Next(this);
                      bVar10 = CheckedError::Check((CheckedError *)this);
                      local_38 = (uint)bVar10;
                      if (!bVar10) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                    }
                    else {
                      bVar10 = IsIdent((Parser *)struct_def,"oneof");
                      if (!bVar10) goto LAB_0012c9b5;
                      bVar5 = true;
                      Next(this);
                      bVar10 = CheckedError::Check((CheckedError *)this);
                      local_38 = (uint)bVar10;
                      if (!bVar10) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                    }
                  }
                }
                if (local_38 == 0) goto LAB_0012c9b5;
              }
              else {
LAB_0012c9b5:
                type.fixed_length = 0;
                type._26_6_ = 0;
                Type::Type((Type *)local_c0,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
                bVar10 = IsIdent((Parser *)struct_def,"group");
                if ((bVar10) || (bVar5)) {
                  if (!bVar5) {
                    name_1.field_2._M_local_buf[0xf] = '\0';
                    Next(this);
                    bVar10 = CheckedError::Check((CheckedError *)this);
                    if (bVar10) {
                      name_1.field_2._M_local_buf[0xf] = '\x01';
                    }
                    local_38 = (uint)bVar10;
                    if ((name_1.field_2._M_local_buf[0xf] & 1U) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (local_38 != 0) goto LAB_0012e206;
                  }
                  if ((bVar5) && ((struct_def[3].super_Definition.file.field_0x2 & 1) != 0)) {
                    ConvertCase(&local_108,
                                (string *)&(struct_def->super_Definition).file._M_string_length,
                                kUpperCamel,kSnake);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_e8,&local_108,"Union");
                    std::__cxx11::string::~string((string *)&local_108);
                    StartEnum(this,(string *)struct_def,SUB81(local_e8,0),(EnumDef **)0x1);
                    bVar10 = CheckedError::Check((CheckedError *)this);
                    local_38 = (uint)bVar10;
                    if (!bVar10) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (local_38 == 0) {
                      Type::Type((Type *)((long)&name_2.field_2 + 8),BASE_TYPE_UNION,
                                 (StructDef *)0x0,(EnumDef *)type._24_8_,0);
                      local_c0 = (undefined1  [8])name_2.field_2._8_8_;
                      type._0_8_ = local_128;
                      type.struct_def = local_120;
                      type.enum_def._0_2_ = local_118;
                      local_38 = 0;
                    }
                    std::__cxx11::string::~string((string *)local_e8);
                  }
                  else {
                    t = *(int *)&struct_def[5].fixed;
                    *(int *)&struct_def[5].fixed = t + 1;
                    NumToString<int>(&local_170,t);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_150,"Anonymous",&local_170);
                    std::__cxx11::string::~string((string *)&local_170);
                    local_171 = 0;
                    StartStruct(this,(string *)struct_def,(StructDef **)local_150);
                    bVar10 = CheckedError::Check((CheckedError *)this);
                    if (bVar10) {
                      local_171 = 1;
                    }
                    local_38 = (uint)bVar10;
                    if ((local_171 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (local_38 == 0) {
                      Type::Type((Type *)&local_198,BASE_TYPE_STRUCT,(StructDef *)0x0,(EnumDef *)0x0
                                 ,0);
                      local_c0 = (undefined1  [8])local_198;
                      type._0_8_ = local_190;
                      type.struct_def = local_188;
                      type.enum_def._0_2_ = local_180;
                      local_38 = 0;
                    }
                    std::__cxx11::string::~string((string *)local_150);
                  }
                }
                else {
                  name.field_2._M_local_buf[0xf] = '\0';
                  ParseTypeFromProtoType(this,(Type *)struct_def);
                  bVar10 = CheckedError::Check((CheckedError *)this);
                  if (bVar10) {
                    name.field_2._M_local_buf[0xf] = '\x01';
                  }
                  local_38 = (uint)bVar10;
                  if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                }
                if (local_38 == 0) {
                  if ((bVar9) &&
                     (local_c0._4_4_ = SUB84(local_c0,0), local_c0._0_4_ = BASE_TYPE_VECTOR,
                     local_c0._4_4_ == BASE_TYPE_VECTOR)) {
                    local_c0 = (undefined1  [8])0xd0000000e;
                  }
                  std::__cxx11::string::string
                            ((string *)local_1c0,
                             (string *)&(struct_def->super_Definition).file._M_string_length);
                  proto_field_id.field_2._M_local_buf[0xf] = '\0';
                  Expect(this,t_00);
                  bVar9 = CheckedError::Check((CheckedError *)this);
                  if (bVar9) {
                    proto_field_id.field_2._M_local_buf[0xf] = '\x01';
                  }
                  local_38 = (uint)bVar9;
                  if ((proto_field_id.field_2._M_local_buf[0xf] & 1U) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (local_38 == 0) {
                    std::__cxx11::string::string(local_1e8);
                    if (bVar5) {
LAB_0012d12d:
                      local_1f8 = (FieldDef *)0x0;
                      if ((local_21 & 1) != 0) {
                        local_1f8 = SymbolTable<flatbuffers::FieldDef>::Lookup
                                              ((SymbolTable<flatbuffers::FieldDef> *)
                                               &psStack_20[6]._M_string_length,(string *)local_1c0);
                      }
                      if (local_1f8 == (FieldDef *)0x0) {
                        val._7_1_ = 0;
                        AddField(this,struct_def,psStack_20,(Type *)local_1c0,(FieldDef **)local_c0)
                        ;
                        bVar9 = CheckedError::Check((CheckedError *)this);
                        if (bVar9) {
                          val._7_1_ = 1;
                        }
                        local_38 = (uint)bVar9;
                        if ((val._7_1_ & 1) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        if (local_38 != 0) goto LAB_0012e1ee;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator=(&(local_1f8->super_Definition).doc_comment,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_88);
                      uVar11 = std::__cxx11::string::empty();
                      if (((uVar11 & 1) == 0) || (bVar5)) {
                        this_00 = (Value *)operator_new(0x48);
                        Value::Value(this_00);
                        local_208 = this_00;
                        std::__cxx11::string::operator=((string *)&this_00->constant,local_1e8);
                        pDVar6 = &local_1f8->super_Definition;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_228,"id",
                                   (allocator<char> *)(key.field_2._M_local_buf + 0xf));
                        SymbolTable<flatbuffers::Value>::Add
                                  (&pDVar6->attributes,&local_228,local_208);
                        std::__cxx11::string::~string((string *)&local_228);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(key.field_2._M_local_buf + 0xf));
                      }
                      bVar9 = IsScalar(local_c0._0_4_);
                      if ((!bVar9) && (bVar4)) {
                        local_1f8->presence = kRequired;
                      }
                      bVar9 = Is((Parser *)struct_def,0x5b);
                      if (bVar9) {
                        key.field_2._M_local_buf[0xe] = '\0';
                        Next(this);
                        bVar9 = CheckedError::Check((CheckedError *)this);
                        if (bVar9) {
                          key.field_2._M_local_buf[0xe] = '\x01';
                        }
                        local_38 = (uint)bVar9;
                        if ((key.field_2._M_local_buf[0xe] & 1U) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        if (local_38 == 0) {
                          do {
                            std::__cxx11::string::string
                                      ((string *)local_250,
                                       (string *)
                                       &(struct_def->super_Definition).file._M_string_length);
                            val_1.field_2._M_local_buf[0xf] = '\0';
                            ParseProtoKey(this);
                            bVar9 = CheckedError::Check((CheckedError *)this);
                            if (bVar9) {
                              val_1.field_2._M_local_buf[0xf] = '\x01';
                            }
                            local_38 = (uint)bVar9;
                            if ((val_1.field_2._M_local_buf[0xf] & 1U) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (local_38 == 0) {
                              val_1.field_2._M_local_buf[0xe] = '\0';
                              Expect(this,t_00);
                              bVar9 = CheckedError::Check((CheckedError *)this);
                              if (bVar9) {
                                val_1.field_2._M_local_buf[0xe] = '\x01';
                              }
                              local_38 = (uint)bVar9;
                              if ((val_1.field_2._M_local_buf[0xe] & 1U) == 0) {
                                CheckedError::~CheckedError((CheckedError *)this);
                              }
                              if (local_38 == 0) {
                                std::__cxx11::string::string
                                          ((string *)local_278,
                                           (string *)
                                           &(struct_def->super_Definition).file._M_string_length);
                                numeric._7_1_ = 0;
                                ParseProtoCurliesOrIdent(this);
                                bVar9 = CheckedError::Check((CheckedError *)this);
                                if (bVar9) {
                                  numeric._7_1_ = 1;
                                }
                                local_38 = (uint)bVar9;
                                if ((numeric._7_1_ & 1) == 0) {
                                  CheckedError::~CheckedError((CheckedError *)this);
                                }
                                if (local_38 == 0) {
                                  bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_250,"default");
                                  if (bVar9) {
                                    pcVar12 = (char *)std::__cxx11::string::c_str();
                                    local_288 = strpbrk(pcVar12,"0123456789-+.");
                                    bVar9 = IsFloat(local_c0._0_4_);
                                    if ((bVar9) &&
                                       (((bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_278,"inf"), bVar9 ||
                                         (bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_278,"+inf"), bVar9)) ||
                                        (bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_278,"-inf"), bVar9)))) {
                                      oneof_struct.reserved_ids.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
                                      bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_278,"inf");
                                      if (bVar9) {
                                        std::allocator<char>::allocator();
                                        oneof_struct.reserved_ids.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1
                                        ;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_2a8,"+inf",
                                                   (allocator<char> *)
                                                   ((long)&oneof_struct.reserved_ids.
                                                                                                                      
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 7));
                                      }
                                      else {
                                        std::__cxx11::string::string(local_2a8,(string *)local_278);
                                      }
                                      std::__cxx11::string::operator=
                                                ((string *)&(local_1f8->value).constant,local_2a8);
                                      std::__cxx11::string::~string(local_2a8);
                                      if ((oneof_struct.reserved_ids.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_
                                          & 1) != 0) {
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)
                                                   ((long)&oneof_struct.reserved_ids.
                                                                                                                      
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 7));
                                      }
                                    }
                                    else {
                                      bVar9 = IsScalar(local_c0._0_4_);
                                      pcVar12 = local_288;
                                      if ((bVar9) &&
                                         (pcVar13 = (char *)std::__cxx11::string::c_str(),
                                         pcVar12 == pcVar13)) {
                                        std::__cxx11::string::operator=
                                                  ((string *)&(local_1f8->value).constant,
                                                   (string *)local_278);
                                      }
                                      else {
                                        bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_278,"true");
                                        if (bVar9) {
                                          std::__cxx11::string::operator=
                                                    ((string *)&(local_1f8->value).constant,
                                                     (string *)local_278);
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_250,"deprecated");
                                    if (bVar9) {
                                      bVar9 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_278,"true");
                                      local_1f8->deprecated = bVar9;
                                    }
                                  }
                                  bVar9 = Is((Parser *)struct_def,0x2c);
                                  if (bVar9) {
                                    oneof_struct.reserved_ids.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
                                    Next(this);
                                    bVar9 = CheckedError::Check((CheckedError *)this);
                                    if (bVar9) {
                                      oneof_struct.reserved_ids.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
                                    }
                                    local_38 = (uint)bVar9;
                                    if ((oneof_struct.reserved_ids.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ &
                                        1) == 0) {
                                      CheckedError::~CheckedError((CheckedError *)this);
                                    }
                                    if (local_38 == 0) {
                                      local_38 = 0;
                                    }
                                  }
                                  else {
                                    local_38 = 9;
                                  }
                                }
                                std::__cxx11::string::~string((string *)local_278);
                              }
                            }
                            std::__cxx11::string::~string((string *)local_250);
                          } while (local_38 == 0);
                          if (local_38 == 9) {
                            oneof_struct.reserved_ids.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
                            Expect(this,t_00);
                            bVar9 = CheckedError::Check((CheckedError *)this);
                            if (bVar9) {
                              oneof_struct.reserved_ids.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
                            }
                            local_38 = (uint)bVar9;
                            if ((oneof_struct.reserved_ids.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 1) == 0)
                            {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (local_38 == 0) goto LAB_0012daeb;
                          }
                        }
                      }
                      else {
LAB_0012daeb:
                        if (type._24_8_ == 0) {
                          Expect(this,t_00);
                          bVar9 = CheckedError::Check((CheckedError *)this);
                          local_38 = (uint)bVar9;
                          if (!bVar9) {
                            CheckedError::~CheckedError((CheckedError *)this);
                          }
                        }
                        else {
                          StructDef::StructDef((StructDef *)local_3f8);
                          field_it._M_current._7_1_ = 0;
                          ParseProtoFields(this,struct_def,SUB81(local_3f8,0),false);
                          bVar9 = CheckedError::Check((CheckedError *)this);
                          if (bVar9) {
                            field_it._M_current._7_1_ = 1;
                          }
                          local_38 = (uint)bVar9;
                          if ((field_it._M_current._7_1_ & 1) == 0) {
                            CheckedError::~CheckedError((CheckedError *)this);
                          }
                          if (local_38 == 0) {
                            bVar9 = Is((Parser *)struct_def,0x3b);
                            if (bVar9) {
                              field_it._M_current._6_1_ = 0;
                              Next(this);
                              bVar9 = CheckedError::Check((CheckedError *)this);
                              if (bVar9) {
                                field_it._M_current._6_1_ = 1;
                              }
                              local_38 = (uint)bVar9;
                              if ((field_it._M_current._6_1_ & 1) == 0) {
                                CheckedError::~CheckedError((CheckedError *)this);
                              }
                              if (local_38 != 0) goto LAB_0012e124;
                            }
                            local_408._M_current =
                                 (FieldDef **)
                                 std::
                                 vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                 ::begin((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                          *)&oneof_struct.fields.dict._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count);
                            while( true ) {
                              oneof_field = (FieldDef *)
                                            std::
                                            vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                            ::end((
                                                  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                                  *)&oneof_struct.fields.dict._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count);
                              bVar9 = __gnu_cxx::operator!=
                                                (&local_408,
                                                 (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                                  *)&oneof_field);
                              if (!bVar9) break;
                              ppFVar14 = __gnu_cxx::
                                         __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                         ::operator*(&local_408);
                              oneof_type = (Type *)*ppFVar14;
                              local_420 = &((FieldDef *)oneof_type)->value;
                              if ((((local_420->type).base_type != BASE_TYPE_STRUCT) ||
                                  ((((FieldDef *)oneof_type)->value).type.struct_def ==
                                   (StructDef *)0x0)) ||
                                 ((((((FieldDef *)oneof_type)->value).type.struct_def)->fixed & 1U)
                                  != 0)) {
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&evb.user_value,"oneof \'",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_1c0);
                                std::operator+(&local_480,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&evb.user_value,
                                               "\' cannot be mapped to a union because member \'");
                                std::operator+(&local_460,&local_480,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)oneof_type);
                                std::operator+(&local_440,&local_460,"\' is not a table type.");
                                Error(this,(string *)struct_def);
                                std::__cxx11::string::~string((string *)&local_440);
                                std::__cxx11::string::~string((string *)&local_460);
                                std::__cxx11::string::~string((string *)&local_480);
                                std::__cxx11::string::~string((string *)&evb.user_value);
                                local_38 = 1;
                                goto LAB_0012e124;
                              }
                              EnumValBuilder::EnumValBuilder
                                        ((EnumValBuilder *)&ev,(Parser *)struct_def,
                                         (EnumDef *)type._24_8_);
                              pEVar15 = EnumValBuilder::CreateEnumerator
                                                  ((EnumValBuilder *)&ev,
                                                   (string *)(local_420->type).struct_def);
                              BVar7 = (local_420->type).base_type;
                              BVar8 = (local_420->type).element;
                              pSVar1 = (local_420->type).struct_def;
                              uVar2 = *(undefined8 *)((long)&(local_420->type).enum_def + 2);
                              *(undefined8 *)((long)&(pEVar15->union_type).struct_def + 2) =
                                   *(undefined8 *)((long)&(local_420->type).struct_def + 2);
                              *(undefined8 *)((long)&(pEVar15->union_type).enum_def + 2) = uVar2;
                              (pEVar15->union_type).base_type = BVar7;
                              (pEVar15->union_type).element = BVar8;
                              (pEVar15->union_type).struct_def = pSVar1;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator=(&pEVar15->doc_comment,
                                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)(oneof_type + 2));
                              EnumValBuilder::AcceptEnumerator((EnumValBuilder *)this,(string *)&ev)
                              ;
                              bVar9 = CheckedError::Check((CheckedError *)this);
                              local_38 = (uint)bVar9;
                              if (!bVar9) {
                                CheckedError::~CheckedError((CheckedError *)this);
                              }
                              if (local_38 == 0) {
                                local_38 = 0;
                              }
                              EnumValBuilder::~EnumValBuilder((EnumValBuilder *)&ev);
                              if (local_38 != 0) goto LAB_0012e124;
                              __gnu_cxx::
                              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                              ::operator++(&local_408);
                            }
                            local_38 = 0;
                          }
LAB_0012e124:
                          StructDef::~StructDef((StructDef *)local_3f8);
                        }
                        if (local_38 == 0) {
                          local_38 = 0;
                        }
                      }
                    }
                    else {
                      field._7_1_ = 0;
                      Expect(this,t_00);
                      bVar9 = CheckedError::Check((CheckedError *)this);
                      if (bVar9) {
                        field._7_1_ = 1;
                      }
                      local_38 = (uint)bVar9;
                      if ((field._7_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (local_38 == 0) {
                        std::__cxx11::string::operator=
                                  (local_1e8,
                                   (string *)&(struct_def->super_Definition).file._M_string_length);
                        field._6_1_ = 0;
                        Expect(this,t_00);
                        bVar9 = CheckedError::Check((CheckedError *)this);
                        if (bVar9) {
                          field._6_1_ = 1;
                        }
                        local_38 = (uint)bVar9;
                        if ((field._6_1_ & 1) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        if (local_38 == 0) goto LAB_0012d12d;
                      }
                    }
LAB_0012e1ee:
                    std::__cxx11::string::~string(local_1e8);
                  }
                  std::__cxx11::string::~string((string *)local_1c0);
                }
              }
LAB_0012e206:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_88);
            }
          }
        }
      }
      if (local_38 != 0) goto LAB_0012e2e9;
    }
    local_39 = 0;
    ParseProtoDecl(this);
    bVar9 = CheckedError::Check((CheckedError *)this);
    if (bVar9) {
      local_39 = 1;
    }
    local_38 = (uint)bVar9;
    if ((local_39 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
  }
LAB_0012e2e9:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoFields(StructDef *struct_def, bool isextend,
                                      bool inside_oneof) {
  EXPECT('{');
  while (token_ != '}') {
    if (IsIdent("message") || IsIdent("extend") || IsIdent("enum")) {
      // Nested declarations.
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("extensions")) {  // Skip these.
      NEXT();
      EXPECT(kTokenIntegerConstant);
      if (Is(kTokenIdentifier)) {
        NEXT();  // to
        NEXT();  // num
      }
      EXPECT(';');
    } else if (IsIdent("option")) {  // Skip these.
      ECHECK(ParseProtoOption());
      EXPECT(';');
    } else if (IsIdent("reserved")) {  // Skip these.
      /**
       * Reserved proto ids can be comma seperated (e.g. 1,2,4,5;)
       * or range based (e.g. 9 to 11;)
       * or combination of them (e.g. 1,2,9 to 11,4,5;)
       * It will be ended by a semicolon.
       */
      NEXT();
      bool range = false;
      voffset_t from = 0;

      while (!Is(';')) {
        if (token_ == kTokenIntegerConstant) {
          voffset_t attribute = 0;
          bool done = StringToNumber(attribute_.c_str(), &attribute);
          if (!done)
            return Error("Protobuf has non positive number in reserved ids");

          if (range) {
            for (voffset_t id = from + 1; id <= attribute; id++)
              struct_def->reserved_ids.push_back(id);

            range = false;
          } else {
            struct_def->reserved_ids.push_back(attribute);
          }

          from = attribute;
        }

        if (attribute_ == "to") range = true;

        NEXT();
      }  // A variety of formats, just skip.

      NEXT();
    } else if (IsIdent("map")) {
      ECHECK(ParseProtoMapField(struct_def));
    } else {
      std::vector<std::string> field_comment = doc_comment_;
      // Parse the qualifier.
      bool required = false;
      bool repeated = false;
      bool oneof = false;
      if (!inside_oneof) {
        if (IsIdent("optional")) {
          // This is the default.
          NEXT();
        } else if (IsIdent("required")) {
          required = true;
          NEXT();
        } else if (IsIdent("repeated")) {
          repeated = true;
          NEXT();
        } else if (IsIdent("oneof")) {
          oneof = true;
          NEXT();
        } else {
          // can't error, proto3 allows decls without any of the above.
        }
      }
      StructDef *anonymous_struct = nullptr;
      EnumDef *oneof_union = nullptr;
      Type type;
      if (IsIdent("group") || oneof) {
        if (!oneof) NEXT();
        if (oneof && opts.proto_oneof_union) {
          auto name = ConvertCase(attribute_, Case::kUpperCamel) + "Union";
          ECHECK(StartEnum(name, true, &oneof_union));
          type = Type(BASE_TYPE_UNION, nullptr, oneof_union);
        } else {
          auto name = "Anonymous" + NumToString(anonymous_counter_++);
          ECHECK(StartStruct(name, &anonymous_struct));
          type = Type(BASE_TYPE_STRUCT, anonymous_struct);
        }
      } else {
        ECHECK(ParseTypeFromProtoType(&type));
      }
      // Repeated elements get mapped to a vector.
      if (repeated) {
        type.element = type.base_type;
        type.base_type = BASE_TYPE_VECTOR;
        if (type.element == BASE_TYPE_VECTOR) {
          // We have a vector or vectors, which FlatBuffers doesn't support.
          // For now make it a vector of string (since the source is likely
          // "repeated bytes").
          // TODO(wvo): A better solution would be to wrap this in a table.
          type.element = BASE_TYPE_STRING;
        }
      }
      std::string name = attribute_;
      EXPECT(kTokenIdentifier);
      std::string proto_field_id;
      if (!oneof) {
        // Parse the field id. Since we're just translating schemas, not
        // any kind of binary compatibility, we can safely ignore these, and
        // assign our own.
        EXPECT('=');
        proto_field_id = attribute_;
        EXPECT(kTokenIntegerConstant);
      }
      FieldDef *field = nullptr;
      if (isextend) {
        // We allow a field to be re-defined when extending.
        // TODO: are there situations where that is problematic?
        field = struct_def->fields.Lookup(name);
      }
      if (!field) ECHECK(AddField(*struct_def, name, type, &field));
      field->doc_comment = field_comment;
      if (!proto_field_id.empty() || oneof) {
        auto val = new Value();
        val->constant = proto_field_id;
        field->attributes.Add("id", val);
      }
      if (!IsScalar(type.base_type) && required) {
        field->presence = FieldDef::kRequired;
      }
      // See if there's a default specified.
      if (Is('[')) {
        NEXT();
        for (;;) {
          auto key = attribute_;
          ECHECK(ParseProtoKey());
          EXPECT('=');
          auto val = attribute_;
          ECHECK(ParseProtoCurliesOrIdent());
          if (key == "default") {
            // Temp: skip non-numeric and non-boolean defaults (enums).
            auto numeric = strpbrk(val.c_str(), "0123456789-+.");
            if (IsFloat(type.base_type) &&
                (val == "inf" || val == "+inf" || val == "-inf")) {
              // Prefer to be explicit with +inf.
              field->value.constant = val == "inf" ? "+inf" : val;
            } else if (IsScalar(type.base_type) && numeric == val.c_str()) {
              field->value.constant = val;
            } else if (val == "true") {
              field->value.constant = val;
            }  // "false" is default, no need to handle explicitly.
          } else if (key == "deprecated") {
            field->deprecated = val == "true";
          }
          if (!Is(',')) break;
          NEXT();
        }
        EXPECT(']');
      }
      if (anonymous_struct) {
        ECHECK(ParseProtoFields(anonymous_struct, false, oneof));
        if (Is(';')) NEXT();
      } else if (oneof_union) {
        // Parse into a temporary StructDef, then transfer fields into an
        // EnumDef describing the oneof as a union.
        StructDef oneof_struct;
        ECHECK(ParseProtoFields(&oneof_struct, false, oneof));
        if (Is(';')) NEXT();
        for (auto field_it = oneof_struct.fields.vec.begin();
             field_it != oneof_struct.fields.vec.end(); ++field_it) {
          const auto &oneof_field = **field_it;
          const auto &oneof_type = oneof_field.value.type;
          if (oneof_type.base_type != BASE_TYPE_STRUCT ||
              !oneof_type.struct_def || oneof_type.struct_def->fixed)
            return Error("oneof '" + name +
                         "' cannot be mapped to a union because member '" +
                         oneof_field.name + "' is not a table type.");
          EnumValBuilder evb(*this, *oneof_union);
          auto ev = evb.CreateEnumerator(oneof_type.struct_def->name);
          ev->union_type = oneof_type;
          ev->doc_comment = oneof_field.doc_comment;
          ECHECK(evb.AcceptEnumerator(oneof_field.name));
        }
      } else {
        EXPECT(';');
      }
    }
  }
  NEXT();
  return NoError();
}